

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O3

Vec_Int_t * Wla_ManCollectNodes(Wla_Man_t *pWla,int fBlack)

{
  uint Entry;
  Vec_Bit_t *pVVar1;
  Vec_Int_t *p;
  int *piVar2;
  long lVar3;
  Vec_Int_t *pVVar4;
  
  pVVar4 = pWla->vSignals;
  if (pVVar4 == (Vec_Int_t *)0x0) {
    __assert_fail("pWla->vSignals",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs.c"
                  ,0x537,"Vec_Int_t *Wla_ManCollectNodes(Wla_Man_t *, int)");
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar2 = (int *)malloc(400);
  p->pArray = piVar2;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      Entry = pVVar4->pArray[lVar3];
      pVVar1 = pWla->vUnmark;
      if (fBlack == 0) {
        if (((int)Entry < 0) || (pVVar1->nSize <= (int)Entry)) goto LAB_0089257a;
        if (((uint)pVVar1->pArray[Entry >> 5] >> (Entry & 0x1f) & 1) != 0) goto LAB_00892537;
      }
      else {
        if (((int)Entry < 0) || (pVVar1->nSize <= (int)Entry)) {
LAB_0089257a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if (((uint)pVVar1->pArray[Entry >> 5] >> (Entry & 0x1f) & 1) == 0) {
LAB_00892537:
          Vec_IntPush(p,Entry);
        }
      }
      lVar3 = lVar3 + 1;
      pVVar4 = pWla->vSignals;
    } while (lVar3 < pVVar4->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Wla_ManCollectNodes( Wla_Man_t * pWla, int fBlack )
{
    Vec_Int_t * vNodes = NULL;
    int i, Entry;

    assert( pWla->vSignals );

    vNodes = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( pWla->vSignals, Entry, i )
    {
        if ( !fBlack && Vec_BitEntry(pWla->vUnmark, Entry) )
            Vec_IntPush( vNodes, Entry );
        
        if ( fBlack && !Vec_BitEntry(pWla->vUnmark, Entry) )
            Vec_IntPush( vNodes, Entry );
    }

    return vNodes;
}